

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  rar_filter *prVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *fmt;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  rar_filter *filter;
  uint uVar18;
  uint uVar19;
  long local_58;
  ulong local_50;
  size_t local_48;
  rar_br *local_40;
  ssize_t *local_38;
  
  iVar6 = -0x1e;
  if (looper < 0x401) {
    local_48 = looper + 1;
    pvVar1 = a->format->data;
    local_40 = (rar_br *)((long)pvVar1 + 0x4f30);
    local_38 = (ssize_t *)((long)pvVar1 + 0x4f40);
    p = (CPpmd7 *)((long)pvVar1 + 0x3d8);
    rc = (IPpmd7_RangeDec *)((long)pvVar1 + 0x4ec8);
    iVar6 = 0;
    do {
      if (*(char *)((long)pvVar1 + 0xd0) == '\0') {
        return -0x1e;
      }
      sVar2 = *(size_t *)((long)pvVar1 + 0x3c8);
      if (sVar2 != 0) {
        uVar16 = *(uint *)((long)pvVar1 + 0xd4);
        if ((ulong)uVar16 != 0) {
          *buff = *(void **)((long)pvVar1 + 0xe0);
          *size = (ulong)uVar16;
          *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
          goto LAB_00129a58;
        }
        *buff = *(void **)((long)pvVar1 + 0x3c0);
        *size = sVar2;
        *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + sVar2;
        *offset = *(int64_t *)((long)pvVar1 + 0xc0);
        *(long *)((long)pvVar1 + 0xc0) = *(long *)((long)pvVar1 + 0xc0) + *size;
        *(long *)((long)pvVar1 + 0x3c8) = *(long *)((long)pvVar1 + 0x3c8) - *size;
        *(long *)((long)pvVar1 + 0x3c0) = *(long *)((long)pvVar1 + 0x3c0) + *size;
        goto LAB_00129b03;
      }
      if ((*(char *)((long)pvVar1 + 0x3d1) != '\0') ||
         ((*(int *)((long)pvVar1 + 0xe8) != 0 &&
          (*(long *)((long)pvVar1 + 0x28) <= *(long *)((long)pvVar1 + 0xb8))))) {
        uVar16 = *(uint *)((long)pvVar1 + 0xd4);
        if ((ulong)uVar16 != 0) {
          pvVar11 = *(void **)((long)pvVar1 + 0xe0);
          *buff = pvVar11;
          *size = (ulong)uVar16;
          *offset = *(int64_t *)((long)pvVar1 + 0xc0);
          *(long *)((long)pvVar1 + 0xc0) = *(long *)((long)pvVar1 + 0xc0) + *size;
          uVar13 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),pvVar11,(int)*size);
          *(undefined8 *)((long)pvVar1 + 0xf0) = uVar13;
          *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
          return 0;
        }
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)((long)pvVar1 + 0xb8);
        if (*(long *)((long)pvVar1 + 8) == *(long *)((long)pvVar1 + 0xf0)) {
          *(undefined1 *)((long)pvVar1 + 0xed) = 1;
          return 1;
        }
        fmt = "File CRC error";
        goto LAB_00129b89;
      }
      if (((*(int *)((long)pvVar1 + 0xe8) == 0) || (*(char *)((long)pvVar1 + 0x3d2) != '\0')) ||
         (sVar2 = *(size_t *)((long)pvVar1 + 0xb0), (long)sVar2 < 1)) {
        if (*(long *)((long)pvVar1 + 0x3b8) == *(long *)((long)pvVar1 + 0x3a8)) {
          pvVar11 = a->format->data;
          filter = *(rar_filter **)((long)pvVar11 + 0x3a0);
          if (filter == (rar_filter *)0x0) {
            return -0x1e;
          }
          lVar3 = *(long *)((long)pvVar11 + 0x3a8);
          local_50 = (ulong)filter->blocklength + lVar3;
          *(undefined8 *)((long)pvVar11 + 0x3a8) = 0x7fffffffffffffff;
          iVar7 = expand(a,(int64_t *)&local_50);
          uVar14 = local_50;
          if (iVar7 != 0) {
            return -0x1e;
          }
          prVar10 = *(rar_filter **)((long)pvVar11 + 0x3a0);
          while( true ) {
            if (prVar10 == (rar_filter *)0x0) {
              return -0x1e;
            }
            if (prVar10 == filter) break;
            prVar10 = prVar10->next;
          }
          if ((long)local_50 < 0) {
            return -0x1e;
          }
          uVar16 = filter->blocklength;
          if (local_50 != lVar3 + (ulong)uVar16) {
            return -0x1e;
          }
          if (*(long *)((long)pvVar11 + 0x390) == 0) {
            pvVar12 = calloc(1,0x40024);
            *(void **)((long)pvVar11 + 0x390) = pvVar12;
            if (pvVar12 == (void *)0x0) {
              return -0x1e;
            }
          }
          if (0x40000 < uVar16) {
            fmt = "Bad RAR file data";
            goto LAB_00129b89;
          }
          iVar7 = copy_from_lzss_window
                            (a,(void *)(*(long *)((long)pvVar11 + 0x390) + 0x20),lVar3,uVar16);
          if (iVar7 != 0) {
            return -0x1e;
          }
          while( true ) {
            iVar7 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar11 + 0x390),
                                   *(size_t *)((long)pvVar11 + 0xb8));
            if (iVar7 == 0) {
              return -0x1e;
            }
            uVar16 = filter->filteredblockaddress;
            uVar9 = filter->filteredblocklength;
            *(rar_filter **)((long)pvVar11 + 0x3a0) = filter->next;
            filter->next = (rar_filter *)0x0;
            delete_filter(filter);
            filter = *(rar_filter **)((long)pvVar11 + 0x3a0);
            if (filter == (rar_filter *)0x0) goto LAB_00129601;
            uVar4 = filter->blockstartpos;
            if ((uVar4 != *(ulong *)((long)pvVar11 + 0x3a8)) || (filter->blocklength != uVar9))
            break;
            memmove((void *)(*(long *)((long)pvVar11 + 0x390) + 0x20),
                    (void *)(*(long *)((long)pvVar11 + 0x390) + (ulong)uVar16 + 0x20),(ulong)uVar9);
          }
          if (filter != (rar_filter *)0x0) {
            if (uVar4 < uVar14) {
              return -0x1e;
            }
            *(ulong *)((long)pvVar11 + 0x3a8) = uVar4;
          }
LAB_00129601:
          *(ulong *)((long)pvVar11 + 0x3b8) = uVar14;
          *(ulong *)((long)pvVar11 + 0x3c0) =
               *(long *)((long)pvVar11 + 0x390) + (ulong)uVar16 + 0x20;
          *(ulong *)((long)pvVar11 + 0x3c8) = (ulong)uVar9;
        }
        else {
          if (*(long *)((long)pvVar1 + 0x4f48) == 0) {
            if (*(long *)((long)a->format->data + 0xa8) < 1) {
LAB_001294da:
              bVar5 = false;
              iVar6 = 0;
            }
            else {
              pvVar11 = rar_read_ahead(a,1,local_38);
              *(void **)((long)pvVar1 + 0x4f48) = pvVar11;
              if (pvVar11 == (void *)0x0) {
                archive_set_error(&a->archive,0x54,"Truncated RAR file data");
                iVar6 = -0x1e;
                bVar5 = true;
              }
              else {
                bVar5 = false;
                iVar6 = 0;
                if (*(int *)((long)pvVar1 + 0x4f38) == 0) {
                  rar_br_fillup(a,local_40);
                  goto LAB_001294da;
                }
              }
            }
            if (bVar5) {
              return iVar6;
            }
          }
          if ((*(char *)((long)pvVar1 + 0x388) != '\0') && (iVar6 = parse_codes(a), iVar6 < -0x14))
          {
            return iVar6;
          }
          if (*(char *)((long)pvVar1 + 0x3d2) == '\0') {
            lVar3 = *(long *)((long)pvVar1 + 0xb8);
            local_58 = lVar3 + -0x104;
            if ((ulong)*(uint *)((long)pvVar1 + 0xe8) < 0x105) {
              local_58 = lVar3;
            }
            local_58 = local_58 + (ulong)*(uint *)((long)pvVar1 + 0xe8);
            if (*(long *)((long)pvVar1 + 0x3a8) < local_58) {
              local_58 = *(long *)((long)pvVar1 + 0x3a8);
            }
            iVar6 = expand(a,&local_58);
            if (iVar6 != 0) {
              return iVar6;
            }
            *(long *)((long)pvVar1 + 0xb0) = local_58 - lVar3;
            *(long *)((long)pvVar1 + 0x3b8) = local_58;
            if (local_58 - lVar3 == 0 && local_58 != *(long *)((long)pvVar1 + 0x3a8)) {
              fmt = "Internal error extracting RAR file";
              goto LAB_00129b89;
            }
          }
          else {
            iVar7 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar7 < 0) {
LAB_00129a77:
              fmt = "Invalid symbol";
LAB_00129b89:
              archive_set_error(&a->archive,0x54,fmt);
              return -0x1e;
            }
            if (iVar7 == *(int *)((long)pvVar1 + 0x3d4)) {
              iVar8 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar8 < 0) goto LAB_00129a77;
              switch(iVar8) {
              case 0:
                *(undefined1 *)((long)pvVar1 + 0x388) = 1;
                iVar6 = read_data_compressed(a,buff,size,offset,local_48);
                return iVar6;
              default:
                goto switchD_001296e2_caseD_1;
              case 2:
                *(undefined1 *)((long)pvVar1 + 0x3d1) = 1;
                goto LAB_001299af;
              case 3:
                archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                return -0x19;
              case 4:
                uVar16 = 0;
                iVar6 = 0x10;
                do {
                  iVar7 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar7 < 0) goto LAB_00129a77;
                  uVar16 = uVar16 | iVar7 << ((byte)iVar6 & 0x1f);
                  iVar6 = iVar6 + -8;
                } while (iVar6 != -8);
                iVar6 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar6 < 0) goto LAB_00129a77;
                uVar15 = iVar6 + 0x20;
                uVar9 = *(uint *)((long)pvVar1 + 0x360) & *(uint *)((long)pvVar1 + 0x358);
                uVar19 = (uVar9 - uVar16) - 2 & *(uint *)((long)pvVar1 + 0x358);
                uVar16 = uVar15;
                do {
                  uVar18 = uVar19;
                  if ((int)uVar19 < (int)uVar9) {
                    uVar18 = uVar9;
                  }
                  uVar18 = (*(int *)((long)pvVar1 + 0x358) - uVar18) + 1;
                  if ((int)uVar16 < (int)uVar18) {
                    uVar18 = uVar16;
                  }
                  pvVar12 = (void *)((long)(int)uVar9 + *(long *)((long)pvVar1 + 0x350));
                  pvVar11 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar19);
                  if (((int)(uVar18 + uVar9) < (int)uVar19) || ((int)(uVar18 + uVar19) < (int)uVar9)
                     ) {
                    memcpy(pvVar12,pvVar11,(long)(int)uVar18);
                  }
                  else if (0 < (int)uVar18) {
                    uVar14 = 0;
                    do {
                      *(undefined1 *)((long)pvVar12 + uVar14) =
                           *(undefined1 *)((long)pvVar11 + uVar14);
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  uVar9 = uVar18 + uVar9 & *(uint *)((long)pvVar1 + 0x358);
                  uVar19 = uVar18 + uVar19 & *(uint *)((long)pvVar1 + 0x358);
                  uVar17 = uVar16 - uVar18;
                  bVar5 = (int)uVar18 <= (int)uVar16;
                  uVar16 = uVar17;
                } while (uVar17 != 0 && bVar5);
                break;
              case 5:
                iVar6 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar6 < 0) goto LAB_00129a77;
                uVar15 = iVar6 + 4;
                uVar9 = *(uint *)((long)pvVar1 + 0x360) & *(uint *)((long)pvVar1 + 0x358);
                uVar19 = uVar9 - 1 & *(uint *)((long)pvVar1 + 0x358);
                uVar16 = uVar15;
                do {
                  uVar18 = uVar19;
                  if ((int)uVar19 < (int)uVar9) {
                    uVar18 = uVar9;
                  }
                  uVar18 = (*(int *)((long)pvVar1 + 0x358) - uVar18) + 1;
                  if ((int)uVar16 < (int)uVar18) {
                    uVar18 = uVar16;
                  }
                  pvVar12 = (void *)((long)(int)uVar9 + *(long *)((long)pvVar1 + 0x350));
                  pvVar11 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar19);
                  if (((int)(uVar18 + uVar9) < (int)uVar19) || ((int)(uVar18 + uVar19) < (int)uVar9)
                     ) {
                    memcpy(pvVar12,pvVar11,(long)(int)uVar18);
                  }
                  else if (0 < (int)uVar18) {
                    uVar14 = 0;
                    do {
                      *(undefined1 *)((long)pvVar12 + uVar14) =
                           *(undefined1 *)((long)pvVar11 + uVar14);
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  uVar9 = uVar18 + uVar9 & *(uint *)((long)pvVar1 + 0x358);
                  uVar19 = uVar18 + uVar19 & *(uint *)((long)pvVar1 + 0x358);
                  uVar17 = uVar16 - uVar18;
                  bVar5 = (int)uVar18 <= (int)uVar16;
                  uVar16 = uVar17;
                } while (uVar17 != 0 && bVar5);
              }
              *(long *)((long)pvVar1 + 0x360) = *(long *)((long)pvVar1 + 0x360) + (ulong)uVar15;
            }
            else {
switchD_001296e2_caseD_1:
              *(char *)(*(long *)((long)pvVar1 + 0x350) +
                       (long)(int)(*(uint *)((long)pvVar1 + 0x358) & *(uint *)((long)pvVar1 + 0x360)
                                  )) = (char)iVar7;
              *(long *)((long)pvVar1 + 0x360) = *(long *)((long)pvVar1 + 0x360) + 1;
              uVar15 = 1;
            }
            *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) + (ulong)uVar15;
          }
          uVar14 = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
          if ((long)*(size_t *)((long)pvVar1 + 0xb0) < (long)uVar14) {
            uVar14 = *(size_t *)((long)pvVar1 + 0xb0);
          }
          iVar6 = copy_from_lzss_window_to_unp(a,buff,*(int64_t *)((long)pvVar1 + 0xb8),uVar14);
          if (iVar6 != 0) {
            return iVar6;
          }
          *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + uVar14;
          *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - uVar14;
          iVar6 = 0;
        }
      }
      else {
        uVar14 = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
        if ((long)sVar2 < (long)uVar14) {
          uVar14 = sVar2;
        }
        iVar6 = copy_from_lzss_window_to_unp(a,buff,*(int64_t *)((long)pvVar1 + 0xb8),uVar14);
        if (iVar6 != 0) {
          return iVar6;
        }
        *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + uVar14;
        *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - uVar14;
        pvVar11 = *buff;
        iVar6 = 0;
        if (pvVar11 != (void *)0x0) {
          *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
          *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
          *offset = *(int64_t *)((long)pvVar1 + 0xc0);
          *(long *)((long)pvVar1 + 0xc0) = *(long *)((long)pvVar1 + 0xc0) + *size;
          uVar13 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),pvVar11,(int)*size);
          *(undefined8 *)((long)pvVar1 + 0xf0) = uVar13;
          return 0;
        }
      }
LAB_001299af:
    } while (*buff == (void *)0x0);
    *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
    *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
LAB_00129a58:
    *offset = *(int64_t *)((long)pvVar1 + 0xc0);
    *(long *)((long)pvVar1 + 0xc0) = *(long *)((long)pvVar1 + 0xc0) + *size;
LAB_00129b03:
    uVar13 = crc32(*(undefined8 *)((long)pvVar1 + 0xf0),*buff,(int)*size);
    *(undefined8 *)((long)pvVar1 + 0xf0) = uVar13;
  }
  return iVar6;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;

      /* We don't want to overflow the window and overwrite data that we write
       * at 'start'. Therefore, reduce the end length by the maximum match size,
       * which is 260 bytes. You can compute this maximum by looking at the
       * definition of 'expand', in particular when 'symbol >= 271'. */
      /* NOTE: It's possible for 'dictionary_size' to be less than this 260
       * value, however that will only be the case when 'unp_size' is small,
       * which should only happen when the entry size is small and there's no
       * risk of overflowing the buffer */
      if (rar->dictionary_size > 260) {
        end -= 260;
      }

      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}